

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

bool __thiscall testing::UnitTest::Failed(UnitTest *this)

{
  UnitTestImpl *this_00;
  bool bVar1;
  int iVar2;
  
  this_00 = this->impl_;
  iVar2 = internal::UnitTestImpl::failed_test_suite_count(this_00);
  if (0 < iVar2) {
    return true;
  }
  bVar1 = TestResult::Failed(&this_00->ad_hoc_test_result_);
  return bVar1;
}

Assistant:

bool UnitTest::Failed() const { return impl()->Failed(); }